

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<1,456>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<1,456> *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  HEAD *pHVar1;
  undefined4 in_stack_ffffffffffffff38;
  
  pHVar1 = head;
  BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>::BaseWithoutMT
            ((BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_> *)this,head,MAT,1);
  readMultiplicity<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((variant<njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
              *)&stack0xffffffffffffff38,(section *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,*(int *)(head + 0x38),*(int *)(head + 0x10),
             (int)pHVar1,in_stack_ffffffffffffff38);
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                     *)(this + 0x10),
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                     *)&stack0xffffffffffffff38);
  std::__detail::__variant::
  _Variant_storage<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
  ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::PolynomialMultiplicity,_njoy::ENDFtk::section::TabulatedMultiplicity>
                       *)&stack0xffffffffffffff38);
  BaseWithoutMT<njoy::ENDFtk::section::Type<1,456>>::
  readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end,lineNumber,MAT,1);
  return;
}

Assistant:

Type ( const HEAD& head,
       Iterator& begin,
       const Iterator& end,
       long& lineNumber,
       int MAT )
  try: BaseWithoutMT( head, MAT, 1 ),
       data_( std::move( readMultiplicity( begin, end, lineNumber,
                                           MAT, 1, head.MT(), head.L2() ) ) ) {
    readSEND( begin, end, lineNumber, MAT, 1 );
  } catch( std::exception& e ) {
    Log::info( "Trouble while reading section {} of File 1 of Material {}",
               head.MT(), MAT );
    throw e;
  }